

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O1

spv_result_t spvtools::val::MemoryPass(ValidationState_t *_,Instruction *inst)

{
  CapabilitySet *pCVar1;
  ValidationState_t *pVVar2;
  ushort uVar3;
  uint16_t uVar4;
  uint16_t uVar5;
  pointer puVar6;
  byte bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  AddressingModel AVar12;
  uint uVar13;
  StorageClass SVar14;
  int32_t iVar15;
  uint32_t uVar16;
  spv_result_t sVar17;
  spv_result_t sVar18;
  long *plVar19;
  Instruction *pIVar20;
  Instruction *pIVar21;
  undefined8 *puVar22;
  DiagnosticStream *pDVar23;
  Instruction *pIVar24;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined7 extraout_var;
  byte bVar25;
  _func_void *p_Var26;
  ulong uVar27;
  byte bVar28;
  long lVar29;
  ulong uVar30;
  byte bVar31;
  char *pcVar32;
  char **ppcVar33;
  spv_const_context psVar34;
  size_t index;
  byte bVar35;
  Op opcode;
  undefined8 uVar36;
  byte bVar37;
  byte bVar38;
  spv_result_t unaff_R15D;
  uint64_t *val;
  bool bVar39;
  string instr_name;
  anon_class_24_3_e757d3e0 ValidateType;
  uint32_t data_type;
  uint64_t stride_value;
  string errorVUID;
  _Any_data local_2a8;
  undefined1 local_298 [24];
  undefined1 local_280 [38];
  byte local_25a;
  char local_259;
  Instruction *local_258;
  uint local_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [24];
  Function *local_220;
  undefined1 local_218 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208 [28];
  spv_result_t local_48;
  undefined8 local_40;
  _Base_ptr local_38;
  
  uVar3 = (inst->inst_).opcode;
  if (0x1141 < uVar3) {
    if (uVar3 < 0x1169) {
      switch(uVar3) {
      case 0x1142:
        goto switchD_002fa941_caseD_3b;
      case 0x1143:
      case 0x1144:
        goto switchD_002fa941_caseD_41;
      case 0x1147:
      case 0x1148:
        goto switchD_002fa941_caseD_43;
      case 0x1149:
        goto switchD_002fa941_caseD_44;
      }
      goto switchD_002fa941_caseD_3c;
    }
    opcode = (Op)uVar3;
    if (OpTypeCooperativeMatrixNV < opcode) {
      if (uVar3 - 0x14ef < 2) {
        if (opcode == OpCooperativeMatrixLoadNV) {
          local_280._0_8_ = "spv::Op::OpCooperativeMatrixLoadNV";
          pIVar20 = inst;
        }
        else {
          uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,1);
          pIVar20 = ValidationState_t::FindDef(_,uVar13);
          local_280._0_8_ = "spv::Op::OpCooperativeMatrixStoreNV";
        }
        uVar16 = (pIVar20->inst_).type_id;
        pIVar20 = ValidationState_t::FindDef(_,uVar16);
        uVar4 = (inst->inst_).opcode;
        if ((pIVar20->inst_).opcode != 0x14ee) {
          if (uVar4 != 0x14ef) {
            ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
            pcVar32 = "spv::Op::OpCooperativeMatrixStoreNV Object type <id> ";
            goto LAB_002fb72a;
          }
          ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
          pcVar32 = "spv::Op::OpCooperativeMatrixLoadNV Result Type <id> ";
          lVar29 = 0x34;
          goto LAB_002fb72f;
        }
        uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)((uint)(uVar4 == 0x14ef) * 2));
        pIVar20 = ValidationState_t::FindDef(_,uVar13);
        if ((pIVar20 == (Instruction *)0x0) ||
           ((AVar12 = ValidationState_t::addressing_model(_), AVar12 == Logical &&
            ((((_->features_).variable_pointers == false &&
              (iVar15 = spvOpcodeReturnsLogicalPointer((uint)(pIVar20->inst_).opcode), iVar15 == 0))
             || (((_->features_).variable_pointers == true &&
                 (bVar10 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar20->inst_).opcode),
                 !bVar10)))))))) {
          ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
          ppcVar33 = (char **)local_280;
          goto LAB_002fbcd5;
        }
        uVar16 = (pIVar20->inst_).type_id;
        pIVar21 = ValidationState_t::FindDef(_,uVar16);
        if ((pIVar21 != (Instruction *)0x0) && ((pIVar21->inst_).opcode == 0x20)) {
          SVar14 = Instruction::GetOperandAs<spv::StorageClass>(pIVar21,1);
          if ((SVar14 != Workgroup) &&
             ((SVar14 != StorageBuffer && (SVar14 != PhysicalStorageBuffer)))) {
            ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
            pDVar23 = DiagnosticStream::operator<<((DiagnosticStream *)local_218,(char **)local_280)
            ;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar23," storage class for pointer type <id> ",0x25);
            ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar16);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar23,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar23," is not Workgroup or StorageBuffer.",0x23);
            local_48 = pDVar23->error_;
            goto LAB_002fc057;
          }
          uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar21,2);
          pIVar21 = ValidationState_t::FindDef(_,uVar13);
          if ((pIVar21 == (Instruction *)0x0) ||
             ((bVar10 = ValidationState_t::IsIntScalarOrVectorType(_,uVar13), !bVar10 &&
              (bVar10 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar13), !bVar10)))) {
            ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
            pDVar23 = DiagnosticStream::operator<<((DiagnosticStream *)local_218,(char **)local_280)
            ;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar23," Pointer <id> ",0xe);
            ValidationState_t::getIdName_abi_cxx11_
                      ((string *)&local_2a8,_,(pIVar20->inst_).result_id);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar23,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
            pcVar32 = "s Type must be a scalar or vector type.";
            lVar29 = 0x27;
            goto LAB_002fbd21;
          }
          uVar13 = Instruction::GetOperandAs<unsigned_int>
                             (inst,(ulong)((inst->inst_).opcode == 0x14ef) | 2);
          pIVar20 = ValidationState_t::FindDef(_,uVar13);
          if ((pIVar20 == (Instruction *)0x0) ||
             (bVar10 = ValidationState_t::IsIntScalarType(_,(pIVar20->inst_).type_id), !bVar10)) {
            ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218,"Stride operand <id> ",0x14);
            ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
            pcVar32 = " must be a scalar integer type.";
            lVar29 = 0x1f;
          }
          else {
            uVar13 = Instruction::GetOperandAs<unsigned_int>
                               (inst,(ulong)((inst->inst_).opcode == 0x14ef) + 3);
            pIVar20 = ValidationState_t::FindDef(_,uVar13);
            if (((pIVar20 != (Instruction *)0x0) &&
                (bVar10 = ValidationState_t::IsBoolScalarType(_,(pIVar20->inst_).type_id), bVar10))
               && ((iVar15 = spvOpcodeIsConstant((uint)(pIVar20->inst_).opcode), iVar15 != 0 ||
                   (iVar15 = spvOpcodeIsSpecConstant((uint)(pIVar20->inst_).opcode), iVar15 != 0))))
            {
              uVar13 = (inst->inst_).opcode == 0x14ef | 4;
              if ((ulong)((long)(inst->operands_).
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(inst->operands_).
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4) <= (ulong)uVar13)
              goto LAB_002fc352;
              unaff_R15D = anon_unknown_2::CheckMemoryAccess(_,inst,uVar13);
              goto joined_r0x002fb2d4;
            }
            ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218,"Column Major operand <id> ",0x1a);
            ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
            pcVar32 = " must be a boolean constant instruction.";
            lVar29 = 0x28;
          }
LAB_002fc040:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar32,lVar29);
          goto LAB_002fc057;
        }
        ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
        ppcVar33 = (char **)local_280;
LAB_002fbb32:
        pDVar23 = DiagnosticStream::operator<<((DiagnosticStream *)local_218,ppcVar33);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar23," type for pointer <id> ",0x17);
        ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar23,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
        pcVar32 = " is not a pointer type.";
        lVar29 = 0x17;
LAB_002fbd21:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar23,pcVar32,lVar29);
        local_48 = pDVar23->error_;
        goto LAB_002fc057;
      }
      if (opcode == OpCooperativeMatrixLengthNV) goto LAB_002fae27;
      if (opcode != OpRawAccessChainNV) goto switchD_002fa941_caseD_3c;
      local_248._0_8_ = inst;
      pcVar32 = spvOpcodeString(OpRawAccessChainNV);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_218,pcVar32,(allocator<char> *)local_280);
      plVar19 = (long *)std::__cxx11::string::replace((ulong)local_218,0,(char *)0x0,0x371e9f);
      local_2a8._M_unused._M_object = local_298;
      p_Var26 = (_func_void *)(plVar19 + 2);
      if ((_func_void *)*plVar19 == p_Var26) {
        local_298._0_8_ = *(undefined8 *)p_Var26;
        local_298._8_8_ = plVar19[3];
      }
      else {
        local_298._0_8_ = *(undefined8 *)p_Var26;
        local_2a8._M_unused._M_object = (_func_void *)*plVar19;
      }
      local_2a8._8_8_ = plVar19[1];
      *plVar19 = (long)p_Var26;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_218._4_4_,local_218._0_4_) != local_208) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_218._4_4_,local_218._0_4_),
                        local_208[0]._M_allocated_capacity + 1);
      }
      pIVar20 = ValidationState_t::FindDef(_,*(uint32_t *)(local_248._0_8_ + 0x40));
      if ((pIVar20->inst_).opcode == 0x20) {
        SVar14 = Instruction::GetOperandAs<spv::StorageClass>(pIVar20,1);
        if (((SVar14 == Uniform) || (SVar14 == StorageBuffer)) || (SVar14 == PhysicalStorageBuffer))
        {
          uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar20,2);
          pIVar20 = ValidationState_t::FindDef(_,uVar13);
          uVar13 = (uint)(pIVar20->inst_).opcode;
          if ((0x1e < uVar13) || ((0x51000000U >> (uVar13 & 0x1f) & 1) == 0)) {
            uVar13 = Instruction::GetOperandAs<unsigned_int>((Instruction *)local_248._0_8_,3);
            pIVar20 = ValidationState_t::FindDef(_,uVar13);
            if ((pIVar20->inst_).opcode != 0x2b) {
              ValidationState_t::diag
                        ((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_DATA,
                         (Instruction *)local_248._0_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_218,"The Stride of ",0xe);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218," <id> ",6);
              ValidationState_t::getIdName_abi_cxx11_
                        ((string *)local_280,_,*(uint32_t *)(local_248._0_8_ + 0x44));
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_218,(char *)local_280._0_8_,local_280._8_8_);
              pcVar32 = " must be OpConstant. Found Op";
              lVar29 = 0x1d;
              goto LAB_002fba48;
            }
            pIVar21 = ValidationState_t::FindDef(_,(pIVar20->inst_).type_id);
            if ((pIVar21->inst_).opcode != 0x15) {
              ValidationState_t::diag
                        ((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_DATA,
                         (Instruction *)local_248._0_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_218,"The type of Stride of ",0x16);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218," <id> ",6);
              ValidationState_t::getIdName_abi_cxx11_
                        ((string *)local_280,_,*(uint32_t *)(local_248._0_8_ + 0x44));
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_218,(char *)local_280._0_8_,local_280._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_218," must be OpTypeInt. Found Op",0x1c);
              local_238._16_8_ = spvOpcodeString((uint)(pIVar21->inst_).opcode);
              goto LAB_002fba68;
            }
            local_280._8_8_ = local_248;
            local_280._0_8_ = _;
            local_280._16_8_ = &local_2a8;
            unaff_R15D = anon_unknown_2::ValidateRawAccessChain::anon_class_24_3_e757d3e0::
                         operator()((anon_class_24_3_e757d3e0 *)local_280,"Index",4);
            if ((unaff_R15D != SPV_SUCCESS) ||
               (unaff_R15D = anon_unknown_2::ValidateRawAccessChain::anon_class_24_3_e757d3e0::
                             operator()((anon_class_24_3_e757d3e0 *)local_280,"Offset",5),
               unaff_R15D != SPV_SUCCESS)) goto LAB_002fc13d;
            uVar13 = 0;
            if (0x60 < (ulong)((long)*(pointer *)(local_248._0_8_ + 0x20) -
                              (long)(((vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                       *)(local_248._0_8_ + 0x18))->
                                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                    )._M_impl.super__Vector_impl_data._M_start)) {
              uVar13 = Instruction::GetOperandAs<unsigned_int>((Instruction *)local_248._0_8_,6);
            }
            if ((uVar13 & 2) != 0) {
              val = (uint64_t *)(local_238 + 0x10);
              local_238._16_8_ = (__buckets_ptr)0x0;
              bVar10 = ValidationState_t::EvalConstantValUint64(_,(pIVar20->inst_).result_id,val);
              bVar39 = (__buckets_ptr)local_238._16_8_ == (__buckets_ptr)0x0;
              if (bVar39 && bVar10) {
                ValidationState_t::diag
                          ((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_DATA,
                           (Instruction *)local_248._0_8_);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218,
                           "Stride must not be zero when per-element robustness is used.",0x3c);
                val = (uint64_t *)(ulong)(uint)local_48;
                DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_218);
              }
              unaff_R15D = (spv_result_t)val;
              if (bVar39 && bVar10) goto LAB_002fc13d;
            }
            if ((uVar13 & 1) == 0) {
              if ((SVar14 == PhysicalStorageBuffer) && ((uVar13 & 2) != 0)) goto LAB_002fdd5f;
LAB_002fe026:
              unaff_R15D = SPV_SUCCESS;
              if ((~uVar13 & 3) != 0) goto LAB_002fc13d;
              ValidationState_t::diag
                        ((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_DATA,
                         (Instruction *)local_248._0_8_);
              pcVar32 = 
              "Per-component robustness and per-element robustness are mutually exclusive.";
              lVar29 = 0x4b;
            }
            else {
              if (SVar14 != PhysicalStorageBuffer) goto LAB_002fe026;
LAB_002fdd5f:
              ValidationState_t::diag
                        ((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_DATA,
                         (Instruction *)local_248._0_8_);
              pcVar32 = 
              "Storage class cannot be PhysicalStorageBuffer when raw access chain robustness is used."
              ;
              lVar29 = 0x57;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar32,lVar29);
            unaff_R15D = local_48;
            goto LAB_002fc138;
          }
          ValidationState_t::diag
                    ((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_DATA,
                     (Instruction *)local_248._0_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,"The Result Type of ",0x13);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218," <id> ",6);
          ValidationState_t::getIdName_abi_cxx11_
                    ((string *)local_280,_,*(uint32_t *)(local_248._0_8_ + 0x44));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,(char *)local_280._0_8_,local_280._8_8_);
          pcVar32 = " must not point to OpTypeArray, OpTypeMatrix, or OpTypeStruct.";
          lVar29 = 0x3e;
        }
        else {
          ValidationState_t::diag
                    ((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_DATA,
                     (Instruction *)local_248._0_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,"The Result Type of ",0x13);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218," <id> ",6);
          ValidationState_t::getIdName_abi_cxx11_
                    ((string *)local_280,_,*(uint32_t *)(local_248._0_8_ + 0x44));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,(char *)local_280._0_8_,local_280._8_8_);
          pcVar32 = 
          " must point to a storage class of StorageBuffer, PhysicalStorageBuffer, or Uniform.";
          lVar29 = 0x53;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar32,lVar29);
        unaff_R15D = local_48;
      }
      else {
        ValidationState_t::diag
                  ((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_DATA,
                   (Instruction *)local_248._0_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,"The Result Type of ",0x13);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218," <id> ",6);
        ValidationState_t::getIdName_abi_cxx11_
                  ((string *)local_280,_,*(uint32_t *)(local_248._0_8_ + 0x44));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,(char *)local_280._0_8_,local_280._8_8_);
        pcVar32 = " must be OpTypePointer. Found Op";
        lVar29 = 0x20;
LAB_002fba48:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar32,lVar29);
        local_238._16_8_ = spvOpcodeString((uint)(pIVar20->inst_).opcode);
LAB_002fba68:
        pDVar23 = DiagnosticStream::operator<<
                            ((DiagnosticStream *)local_218,(char **)(local_238 + 0x10));
        local_298[0x17] = 0x2e;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar23,local_298 + 0x17,1);
        unaff_R15D = pDVar23->error_;
      }
LAB_002fc119:
      if ((ValidationState_t *)local_280._0_8_ != (ValidationState_t *)(local_280 + 0x10)) {
        operator_delete((void *)local_280._0_8_,(ulong)(local_280._16_8_ + 1));
      }
LAB_002fc138:
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_218);
      goto LAB_002fc13d;
    }
    if (1 < uVar3 - 0x1169) {
      if (opcode != OpCooperativeMatrixLengthKHR) goto switchD_002fa941_caseD_3c;
LAB_002fae27:
      pcVar32 = spvOpcodeString(opcode);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_218,pcVar32,(allocator<char> *)local_280);
      puVar22 = (undefined8 *)std::__cxx11::string::replace((ulong)local_218,0,(char *)0x0,0x371e9f)
      ;
      p_Var26 = (_func_void *)(puVar22 + 2);
      if ((_func_void *)*puVar22 == p_Var26) {
        local_298._0_8_ = *(undefined8 *)p_Var26;
        local_298._8_8_ = puVar22[3];
        local_2a8._M_unused._M_object = local_298;
      }
      else {
        local_298._0_8_ = *(undefined8 *)p_Var26;
        local_2a8._M_unused._M_object = (_func_void *)*puVar22;
      }
      local_2a8._8_8_ = puVar22[1];
      *puVar22 = p_Var26;
      puVar22[1] = 0;
      *(undefined1 *)(puVar22 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_218._4_4_,local_218._0_4_) != local_208) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_218._4_4_,local_218._0_4_),
                        local_208[0]._M_allocated_capacity + 1);
      }
      pIVar20 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
      if ((((pIVar20->inst_).opcode == 0x15) &&
          (uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar20,1), uVar13 == 0x20)) &&
         (uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar20,2), uVar13 == 0)) {
        uVar4 = (inst->inst_).opcode;
        uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,2);
        pIVar20 = ValidationState_t::FindDef(_,uVar13);
        uVar5 = (pIVar20->inst_).opcode;
        if (uVar4 == 0x116c) {
          if (uVar5 != 0x1168) {
            ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218,"The type in ",0xc);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218," <id> ",6);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_280,_,uVar13);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218,(char *)local_280._0_8_,local_280._8_8_);
            pcVar32 = " must be OpTypeCooperativeMatrixKHR.";
            lVar29 = 0x24;
            goto LAB_002fb5bb;
          }
        }
        else if (uVar5 != 0x14ee) {
          ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,"The type in ",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218," <id> ",6);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_280,_,uVar13);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,(char *)local_280._0_8_,local_280._8_8_);
          pcVar32 = " must be OpTypeCooperativeMatrixNV.";
          lVar29 = 0x23;
          goto LAB_002fb5bb;
        }
        unaff_R15D = SPV_SUCCESS;
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,"The Result Type of ",0x13);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218," <id> ",6);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_280,_,(inst->inst_).result_id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,(char *)local_280._0_8_,local_280._8_8_);
        pcVar32 = " must be OpTypeInt with width 32 and signedness 0.";
        lVar29 = 0x32;
LAB_002fb5bb:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar32,lVar29);
        if ((ValidationState_t *)local_280._0_8_ != (ValidationState_t *)(local_280 + 0x10)) {
          operator_delete((void *)local_280._0_8_,(ulong)(local_280._16_8_ + 1));
        }
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_218);
        unaff_R15D = local_48;
      }
      if ((undefined1 *)local_2a8._M_unused._0_8_ == local_298) goto joined_r0x002fc156;
      goto LAB_002fc146;
    }
    if (opcode == OpCooperativeMatrixLoadKHR) {
      local_248._0_8_ = "spv::Op::OpCooperativeMatrixLoadKHR";
      pIVar20 = inst;
    }
    else {
      uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,1);
      pIVar20 = ValidationState_t::FindDef(_,uVar13);
      local_248._0_8_ = "spv::Op::OpCooperativeMatrixStoreKHR";
    }
    uVar16 = (pIVar20->inst_).type_id;
    pIVar20 = ValidationState_t::FindDef(_,uVar16);
    uVar4 = (inst->inst_).opcode;
    if ((pIVar20->inst_).opcode != 0x1168) {
      if (uVar4 == 0x1169) {
        ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
        pcVar32 = "spv::Op::OpCooperativeMatrixLoadKHR Result Type <id> ";
LAB_002fb72a:
        lVar29 = 0x35;
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
        pcVar32 = "spv::Op::OpCooperativeMatrixStoreKHR Object type <id> ";
        lVar29 = 0x36;
      }
LAB_002fb72f:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar32,lVar29);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
      pcVar32 = " is not a cooperative matrix type.";
      lVar29 = 0x22;
      goto LAB_002fc040;
    }
    uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)((uint)(uVar4 == 0x1169) * 2));
    pIVar20 = ValidationState_t::FindDef(_,uVar13);
    if ((pIVar20 == (Instruction *)0x0) ||
       ((AVar12 = ValidationState_t::addressing_model(_), AVar12 == Logical &&
        ((((_->features_).variable_pointers == false &&
          (iVar15 = spvOpcodeReturnsLogicalPointer((uint)(pIVar20->inst_).opcode), iVar15 == 0)) ||
         (((_->features_).variable_pointers == true &&
          (bVar10 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar20->inst_).opcode), !bVar10))
         )))))) {
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      ppcVar33 = (char **)local_248;
LAB_002fbcd5:
      pDVar23 = DiagnosticStream::operator<<((DiagnosticStream *)local_218,ppcVar33);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar23," Pointer <id> ",0xe);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar23,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
      pcVar32 = " is not a logical pointer.";
      lVar29 = 0x1a;
      goto LAB_002fbd21;
    }
    uVar16 = (pIVar20->inst_).type_id;
    local_258 = (Instruction *)CONCAT44(local_258._4_4_,uVar16);
    pIVar21 = ValidationState_t::FindDef(_,uVar16);
    if (pIVar21 == (Instruction *)0x0) {
LAB_002fbb12:
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      ppcVar33 = (char **)local_248;
      goto LAB_002fbb32;
    }
    uVar3 = (pIVar21->inst_).opcode;
    unaff_R15D = (spv_result_t)uVar3;
    if ((uVar3 != 0x20) && (uVar3 != 0x1141)) goto LAB_002fbb12;
    SVar14 = Instruction::GetOperandAs<spv::StorageClass>(pIVar21,1);
    if ((SVar14 != Workgroup) && ((SVar14 != StorageBuffer && (SVar14 != PhysicalStorageBuffer)))) {
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2a8,_,0x230d,(char *)0x0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
      pDVar23 = DiagnosticStream::operator<<((DiagnosticStream *)local_218,(char **)local_248);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar23," storage class for pointer type <id> ",0x25);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_280,_,(uint32_t)local_258);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar23,(char *)local_280._0_8_,local_280._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar23," is not Workgroup, StorageBuffer, or PhysicalStorageBuffer.",
                 0x3b);
      local_48 = pDVar23->error_;
      if ((ValidationState_t *)local_280._0_8_ != (ValidationState_t *)(local_280 + 0x10)) {
        operator_delete((void *)local_280._0_8_,(ulong)(local_280._16_8_ + 1));
      }
      goto LAB_002fc057;
    }
    if (uVar3 != 0x1141) {
      uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar21,2);
      pIVar21 = ValidationState_t::FindDef(_,uVar13);
      if (pIVar21 == (Instruction *)0x0) {
LAB_002fd0b0:
        ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
        pDVar23 = DiagnosticStream::operator<<((DiagnosticStream *)local_218,(char **)local_248);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar23," Pointer <id> ",0xe);
        ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,(pIVar20->inst_).result_id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar23,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar23,"s Type must be a scalar or vector type.",0x27);
        unaff_R15D = pDVar23->error_;
        if ((ValidationState_t *)local_2a8._M_unused._0_8_ != (ValidationState_t *)local_298) {
          operator_delete(local_2a8._M_unused._M_object,
                          (ulong)((long)(spv_target_env *)local_298._0_8_ + 1));
        }
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_218);
        bVar10 = false;
      }
      else {
        bVar39 = ValidationState_t::IsIntScalarOrVectorType(_,uVar13);
        bVar10 = true;
        if ((!bVar39) && (bVar39 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar13), !bVar39))
        goto LAB_002fd0b0;
      }
      if (!bVar10) goto joined_r0x002fc156;
    }
    uVar13 = Instruction::GetOperandAs<unsigned_int>
                       (inst,(ulong)((inst->inst_).opcode == 0x1169) | 2);
    pIVar20 = ValidationState_t::FindDef(_,uVar13);
    if (((pIVar20 == (Instruction *)0x0) ||
        (bVar10 = ValidationState_t::IsIntScalarType(_,(pIVar20->inst_).type_id), !bVar10)) ||
       (iVar15 = spvOpcodeIsConstant((uint)(pIVar20->inst_).opcode), iVar15 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"MemoryLayout operand <id> ",0x1a);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
      pcVar32 = " must be a 32-bit integer constant instruction.";
      lVar29 = 0x2f;
      goto LAB_002fc040;
    }
    bVar10 = ValidationState_t::EvalConstantValUint64(_,uVar13,(uint64_t *)local_280);
    index = (ulong)((inst->inst_).opcode == 0x1169) + 3;
    if (index < (ulong)((long)(inst->operands_).
                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(inst->operands_).
                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4)) {
      uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,index);
      pIVar20 = ValidationState_t::FindDef(_,uVar13);
      if (pIVar20 == (Instruction *)0x0) {
LAB_002fd21c:
        ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,"Stride operand <id> ",0x14);
        ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218," must be a scalar integer type.",0x1f);
        if ((ValidationState_t *)local_2a8._M_unused._0_8_ != (ValidationState_t *)local_298) {
          operator_delete(local_2a8._M_unused._M_object,
                          (ulong)((long)(spv_target_env *)local_298._0_8_ + 1));
        }
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_218);
        bVar10 = false;
        unaff_R15D = local_48;
      }
      else {
        bVar39 = ValidationState_t::IsIntScalarType(_,(pIVar20->inst_).type_id);
        bVar10 = true;
        if (!bVar39) goto LAB_002fd21c;
      }
      if (!bVar10) goto joined_r0x002fc156;
    }
    else if (bVar10 && (ulong)local_280._0_8_ < (ValidationState_t *)0x2) {
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"MemoryLayout ",0xd);
      std::ostream::_M_insert<unsigned_long>((ulong)local_218);
      pcVar32 = " requires a Stride.";
      lVar29 = 0x13;
      goto LAB_002fbd60;
    }
    uVar13 = (inst->inst_).opcode == 0x1169 | 4;
    if ((ulong)uVar13 <
        (ulong)((long)(inst->operands_).
                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(inst->operands_).
                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4)) {
      unaff_R15D = anon_unknown_2::CheckMemoryAccess(_,inst,uVar13);
joined_r0x002fb2d4:
      if (unaff_R15D != SPV_SUCCESS) goto joined_r0x002fc156;
    }
    goto LAB_002fc352;
  }
  switch(uVar3) {
  case 0x3b:
switchD_002fa941_caseD_3b:
    unaff_R15D = anon_unknown_2::ValidateVariable(_,inst);
    break;
  case 0x3c:
  case 0x45:
    goto switchD_002fa941_caseD_3c;
  case 0x3d:
    pIVar20 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if (pIVar20 == (Instruction *)0x0) {
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"OpLoad Result Type <id> ",0x18);
      uVar16 = (inst->inst_).type_id;
LAB_002fb852:
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
      pcVar32 = " is not defined.";
      lVar29 = 0x10;
      goto LAB_002fc040;
    }
    uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar21 = ValidationState_t::FindDef(_,uVar13);
    if ((pIVar21 == (Instruction *)0x0) ||
       ((AVar12 = ValidationState_t::addressing_model(_), AVar12 == Logical &&
        ((((_->features_).variable_pointers == false &&
          (iVar15 = spvOpcodeReturnsLogicalPointer((uint)(pIVar21->inst_).opcode), iVar15 == 0)) ||
         (((_->features_).variable_pointers == true &&
          (bVar10 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar21->inst_).opcode), !bVar10))
         )))))) {
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      pcVar32 = "OpLoad Pointer <id> ";
      lVar29 = 0x14;
      goto LAB_002fc00d;
    }
    pIVar24 = ValidationState_t::FindDef(_,(pIVar21->inst_).type_id);
    if (pIVar24 != (Instruction *)0x0) {
      uVar4 = (pIVar24->inst_).opcode;
      if (uVar4 == 0x20) {
        uVar11 = Instruction::GetOperandAs<unsigned_int>(pIVar24,2);
        pIVar24 = ValidationState_t::FindDef(_,uVar11);
        if ((pIVar24 == (Instruction *)0x0) ||
           ((pIVar20->inst_).result_id != (pIVar24->inst_).result_id)) {
          ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,"OpLoad Result Type <id> ",0x18);
          ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,(inst->inst_).type_id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218," does not match Pointer <id> ",0x1d);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_280,_,(pIVar21->inst_).result_id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,(char *)local_280._0_8_,local_280._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"s type.",7);
          pIVar21 = (Instruction *)(ulong)(uint)local_48;
          if ((ValidationState_t *)local_280._0_8_ != (ValidationState_t *)(local_280 + 0x10)) {
            operator_delete((void *)local_280._0_8_,(ulong)(local_280._16_8_ + 1));
          }
          if ((ValidationState_t *)local_2a8._M_unused._0_8_ != (ValidationState_t *)local_298) {
            operator_delete(local_2a8._M_unused._M_object,
                            (ulong)((long)(spv_target_env *)local_298._0_8_ + 1));
          }
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_218);
          bVar10 = false;
        }
        else {
          bVar10 = true;
        }
        unaff_R15D = (spv_result_t)pIVar21;
        if (!bVar10) break;
      }
      else if (uVar4 != 0x1141) goto LAB_002faf72;
      if ((_->options_->before_hlsl_legalization == false) &&
         (bVar10 = ValidationState_t::ContainsRuntimeArray(_,(inst->inst_).type_id), bVar10)) {
        ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
        pcVar32 = "Cannot load a runtime-sized array";
        lVar29 = 0x21;
        goto LAB_002fbd60;
      }
      unaff_R15D = anon_unknown_2::CheckMemoryAccess(_,inst,3);
      if (unaff_R15D == SPV_SUCCESS) {
        bVar10 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,Shader);
        if ((((bVar10) &&
             (bVar10 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id),
             bVar10)) && (uVar3 = (pIVar20->inst_).opcode, 3 < uVar3 - 0x15)) && (uVar3 != 0x20)) {
          ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
          pcVar32 = "8- or 16-bit loads must be a scalar, vector or matrix type";
          lVar29 = 0x3a;
          goto LAB_002fbd60;
        }
        unaff_R15D = SPV_SUCCESS;
        ValidationState_t::RegisterQCOMImageProcessingTextureConsumer
                  (_,uVar13,inst,(Instruction *)0x0);
      }
      break;
    }
LAB_002faf72:
    ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
    pcVar32 = "OpLoad type for pointer <id> ";
    lVar29 = 0x1d;
LAB_002fbada:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar32,lVar29);
    ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
    pcVar32 = " is not a pointer type.";
    lVar29 = 0x17;
    goto LAB_002fc040;
  case 0x3e:
    uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar20 = ValidationState_t::FindDef(_,uVar13);
    if ((pIVar20 == (Instruction *)0x0) ||
       ((AVar12 = ValidationState_t::addressing_model(_), AVar12 == Logical &&
        ((((_->features_).variable_pointers == false &&
          (iVar15 = spvOpcodeReturnsLogicalPointer((uint)(pIVar20->inst_).opcode), iVar15 == 0)) ||
         (((_->features_).variable_pointers == true &&
          (bVar10 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar20->inst_).opcode), !bVar10))
         )))))) {
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      pcVar32 = "OpStore Pointer <id> ";
      lVar29 = 0x15;
LAB_002fc00d:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar32,lVar29);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
      pcVar32 = " is not a logical pointer.";
      lVar29 = 0x1a;
      goto LAB_002fc040;
    }
    pIVar21 = ValidationState_t::FindDef(_,(pIVar20->inst_).type_id);
    if (pIVar21 == (Instruction *)0x0) {
LAB_002fbab3:
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      pcVar32 = "OpStore type for pointer <id> ";
      lVar29 = 0x1e;
      goto LAB_002fbada;
    }
    uVar4 = (pIVar21->inst_).opcode;
    if (uVar4 == 0x20) {
      uVar11 = Instruction::GetOperandAs<unsigned_int>(pIVar21,2);
      local_258 = ValidationState_t::FindDef(_,uVar11);
      if ((local_258 == (Instruction *)0x0) || ((local_258->inst_).opcode == 0x13)) {
        ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,"OpStore Pointer <id> ",0x15);
        local_24c = uVar13;
        ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,"s type is void.",0xf);
        unaff_R15D = local_48;
        if ((ValidationState_t *)local_2a8._M_unused._0_8_ != (ValidationState_t *)local_298) {
          operator_delete(local_2a8._M_unused._M_object,
                          (ulong)((long)(spv_target_env *)local_298._0_8_ + 1));
        }
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_218);
        bVar10 = false;
        uVar13 = local_24c;
      }
      else {
        bVar10 = true;
      }
      if (!bVar10) break;
    }
    else {
      if (uVar4 != 0x1141) goto LAB_002fbab3;
      local_258 = (Instruction *)0x0;
    }
    bVar10 = ValidationState_t::GetPointerTypeInfo
                       (_,(pIVar21->inst_).result_id,(uint32_t *)local_248,
                        (StorageClass *)(local_238 + 0x10));
    if (bVar10) {
      if (((uint)local_238._16_4_ < 10) && ((0x203U >> (local_238._16_4_ & 0x1f) & 1) != 0)) {
        ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,"OpStore Pointer <id> ",0x15);
        ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
        pcVar32 = " storage class is read-only";
        lVar29 = 0x1b;
        goto LAB_002fcd97;
      }
      if (local_238._16_4_ != 0x14db) {
        if (local_238._16_4_ != 0x14df) goto LAB_002fdb6b;
        ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,
                   "ShaderRecordBufferKHR Storage Class variables are read only",0x3b);
        unaff_R15D = local_48;
        goto LAB_002fcdc9;
      }
      local_24c = uVar13;
      ValidationState_t::VkErrorID_abi_cxx11_((string *)local_218,_,0x125f,(char *)0x0);
      local_220 = ValidationState_t::function(_,inst->function_->id_);
      pVVar2 = (ValidationState_t *)(local_280 + 0x10);
      local_280._0_8_ = pVVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_280,CONCAT44(local_218._4_4_,local_218._0_4_),
                 (long)(uint16_t *)local_218._8_8_ + CONCAT44(local_218._4_4_,local_218._0_4_));
      local_298._0_8_ = (spv_const_context)0x0;
      local_298._8_8_ = (spv_const_validator_options)0x0;
      local_2a8._M_unused._M_object = (void *)0x0;
      local_2a8._8_8_ = 0;
      local_2a8._M_unused._M_object = operator_new(0x20);
      ((ValidationState_t *)local_2a8._M_unused._0_8_)->context_ =
           (spv_const_context)&((ValidationState_t *)local_2a8._M_unused._0_8_)->words_;
      if ((ValidationState_t *)local_280._0_8_ == pVVar2) {
        ((ValidationState_t *)local_2a8._M_unused._0_8_)->words_ = (uint32_t *)local_280._16_8_;
        ((ValidationState_t *)local_2a8._M_unused._0_8_)->num_words_ = local_280._24_8_;
      }
      else {
        ((ValidationState_t *)local_2a8._M_unused._0_8_)->context_ =
             (spv_const_context)local_280._0_8_;
        ((ValidationState_t *)local_2a8._M_unused._0_8_)->words_ = (uint32_t *)local_280._16_8_;
      }
      ((ValidationState_t *)local_2a8._M_unused._0_8_)->options_ =
           (spv_const_validator_options)local_280._8_8_;
      local_280._8_8_ = (spv_const_validator_options)0x0;
      local_280._16_8_ = local_280._16_8_ & 0xffffffffffffff00;
      local_298._8_8_ =
           std::
           _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_memory.cpp:1082:15)>
           ::_M_invoke;
      local_298._0_8_ =
           std::
           _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_memory.cpp:1082:15)>
           ::_M_manager;
      local_280._0_8_ = pVVar2;
      Function::RegisterExecutionModelLimitation
                (local_220,
                 (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                  *)&local_2a8);
      if ((spv_const_context)local_298._0_8_ != (spv_const_context)0x0) {
        (*(code *)local_298._0_8_)(&local_2a8,&local_2a8,3);
      }
      uVar13 = local_24c;
      if ((ValidationState_t *)local_280._0_8_ != pVVar2) {
        operator_delete((void *)local_280._0_8_,(ulong)(local_280._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_218._4_4_,local_218._0_4_) != local_208) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_218._4_4_,local_218._0_4_),
                        local_208[0]._M_allocated_capacity + 1);
      }
LAB_002fdb6b:
      bVar39 = spvIsVulkanEnv(_->context_->target_env);
      bVar10 = true;
      if (((bVar39) && (local_238._16_4_ == 2)) &&
         (pIVar20 = ValidationState_t::TracePointer(_,pIVar20), (pIVar20->inst_).opcode == 0x3b)) {
        uVar11 = Instruction::GetOperandAs<unsigned_int>(pIVar20,0);
        pIVar20 = ValidationState_t::FindDef(_,uVar11);
        uVar11 = Instruction::GetOperandAs<unsigned_int>(pIVar20,2);
        pIVar20 = ValidationState_t::FindDef(_,uVar11);
        if (((pIVar20->inst_).opcode & 0xfffe) == 0x1c) {
          uVar11 = Instruction::GetOperandAs<unsigned_int>(pIVar20,1);
          pIVar20 = ValidationState_t::FindDef(_,uVar11);
        }
        bVar10 = ValidationState_t::HasDecoration(_,(pIVar20->inst_).result_id,Block);
        if (bVar10) {
          ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)local_280,_,0x1b0d,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,(char *)local_280._0_8_,local_280._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,
                     "In the Vulkan environment, cannot store to Uniform Blocks",0x39);
          unaff_R15D = local_48;
          if ((ValidationState_t *)local_280._0_8_ != (ValidationState_t *)(local_280 + 0x10)) {
            operator_delete((void *)local_280._0_8_,(ulong)(local_280._16_8_ + 1));
          }
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_218);
        }
        bVar10 = !bVar10;
      }
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"OpStore Pointer <id> ",0x15);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
      pcVar32 = " is not pointer type";
      lVar29 = 0x14;
LAB_002fcd97:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar32,lVar29);
      unaff_R15D = local_48;
      if ((ValidationState_t *)local_2a8._M_unused._0_8_ != (ValidationState_t *)local_298) {
        operator_delete(local_2a8._M_unused._M_object,
                        (ulong)((long)(spv_target_env *)local_298._0_8_ + 1));
      }
LAB_002fcdc9:
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_218);
      bVar10 = false;
    }
    if (bVar10) {
      uVar11 = Instruction::GetOperandAs<unsigned_int>(inst,1);
      pIVar20 = ValidationState_t::FindDef(_,uVar11);
      if ((pIVar20 == (Instruction *)0x0) || (uVar16 = (pIVar20->inst_).type_id, uVar16 == 0)) {
        ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,"OpStore Object <id> ",0x14);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_280,_,uVar11);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,(char *)local_280._0_8_,local_280._8_8_);
        pcVar32 = " is not an object.";
        lVar29 = 0x12;
LAB_002fcee1:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar32,lVar29);
      }
      else {
        pIVar21 = ValidationState_t::FindDef(_,uVar16);
        if ((pIVar21 == (Instruction *)0x0) || (uVar4 = (pIVar21->inst_).opcode, uVar4 == 0x13)) {
          ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,"OpStore Object <id> ",0x14);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_280,_,uVar11);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,(char *)local_280._0_8_,local_280._8_8_);
          pcVar32 = "s type is void.";
          lVar29 = 0xf;
          goto LAB_002fcee1;
        }
        if ((local_258 == (Instruction *)0x0) ||
           ((local_258->inst_).result_id == (pIVar21->inst_).result_id)) {
LAB_002fd767:
          unaff_R15D = anon_unknown_2::CheckMemoryAccess(_,inst,2);
          if (unaff_R15D == SPV_SUCCESS) {
            bVar10 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,Shader);
            unaff_R15D = SPV_SUCCESS;
            if (((bVar10) &&
                (bVar10 = ValidationState_t::ContainsLimitedUseIntOrFloatType
                                    (_,(inst->inst_).type_id), bVar10)) &&
               ((uVar13 = (pIVar21->inst_).opcode - 0x15, 0xb < (ushort)uVar13 ||
                ((0x80fU >> (uVar13 & 0x1f) & 1) == 0)))) {
              ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
              pcVar32 = "8- or 16-bit stores must be a scalar, vector or matrix type";
              lVar29 = 0x3b;
              goto LAB_002fbd60;
            }
          }
          break;
        }
        if ((_->options_->relax_struct_store == true) &&
           ((uVar4 == 0x1e && ((local_258->inst_).opcode == 0x1e)))) {
          bVar10 = anon_unknown_2::AreLayoutCompatibleStructs(_,local_258,pIVar21);
          if (bVar10) goto LAB_002fd767;
          ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,"OpStore Pointer <id> ",0x15);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_280,_,uVar13);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,(char *)local_280._0_8_,local_280._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,"s layout does not match Object <id> ",0x24);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_248,_,(pIVar20->inst_).result_id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,(char *)local_248._0_8_,local_248._8_8_);
          pcVar32 = "s layout.";
          lVar29 = 9;
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,"OpStore Pointer <id> ",0x15);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_280,_,uVar13);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,(char *)local_280._0_8_,local_280._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,"s type does not match Object <id> ",0x22);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_248,_,(pIVar20->inst_).result_id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,(char *)local_248._0_8_,local_248._8_8_);
          pcVar32 = "s type.";
          lVar29 = 7;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar32,lVar29);
        if ((Instruction *)local_248._0_8_ != (Instruction *)local_238) {
          operator_delete((void *)local_248._0_8_,local_238._0_8_ + 1);
        }
      }
      psVar34 = (spv_const_context)local_280._16_8_;
      uVar36 = local_280._0_8_;
      if ((ValidationState_t *)local_280._0_8_ != (ValidationState_t *)(local_280 + 0x10))
      goto LAB_002fc061;
LAB_002fc071:
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_218);
      unaff_R15D = local_48;
    }
    break;
  case 0x3f:
  case 0x40:
    uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar20 = ValidationState_t::FindDef(_,uVar13);
    if (pIVar20 == (Instruction *)0x0) {
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"Target operand <id> ",0x14);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
      pcVar32 = " is not defined.";
      lVar29 = 0x10;
LAB_002fb801:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar32,lVar29);
LAB_002fc057:
      psVar34 = (spv_const_context)local_298._0_8_;
      uVar36 = local_2a8._M_unused._0_8_;
      if ((ValidationState_t *)local_2a8._M_unused._0_8_ == (ValidationState_t *)local_298)
      goto LAB_002fc071;
LAB_002fc061:
      operator_delete((void *)uVar36,(ulong)((long)&psVar34->target_env + 1));
      goto LAB_002fc071;
    }
    uVar16 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar21 = ValidationState_t::FindDef(_,uVar16);
    if (pIVar21 == (Instruction *)0x0) {
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"Source operand <id> ",0x14);
      goto LAB_002fb852;
    }
    pIVar20 = ValidationState_t::FindDef(_,(pIVar20->inst_).type_id);
    if ((pIVar20 == (Instruction *)0x0) ||
       ((uVar4 = (pIVar20->inst_).opcode, uVar4 != 0x20 && (uVar4 != 0x1141)))) {
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"Target operand <id> ",0x14);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
      pcVar32 = " is not a pointer.";
      lVar29 = 0x12;
      goto LAB_002fb801;
    }
    local_258 = pIVar20;
    pIVar20 = ValidationState_t::FindDef(_,(pIVar21->inst_).type_id);
    if ((pIVar20 == (Instruction *)0x0) ||
       ((uVar4 = (pIVar20->inst_).opcode, uVar4 != 0x20 && (uVar4 != 0x1141)))) {
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"Source operand <id> ",0x14);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
      pcVar32 = " is not a pointer.";
      lVar29 = 0x12;
      goto LAB_002fc040;
    }
    if ((inst->inst_).opcode == 0x3f) {
      if ((local_258->inst_).opcode == 0x20) {
        uVar11 = Instruction::GetOperandAs<unsigned_int>(local_258,2);
        pIVar21 = ValidationState_t::FindDef(_,uVar11);
        if ((pIVar21 != (Instruction *)0x0) && ((pIVar21->inst_).opcode != 0x13)) goto LAB_002fcf62;
        ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,"Target operand <id> ",0x14);
        ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218," cannot be a void pointer.",0x1a);
        sVar17 = local_48;
LAB_002fd011:
        if ((ValidationState_t *)local_2a8._M_unused._0_8_ != (ValidationState_t *)local_298) {
          operator_delete(local_2a8._M_unused._M_object,
                          (ulong)((long)(spv_target_env *)local_298._0_8_ + 1));
        }
LAB_002fd02b:
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_218);
        bVar10 = false;
      }
      else {
        pIVar21 = (Instruction *)0x0;
LAB_002fcf62:
        if (uVar4 == 0x20) {
          uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar20,2);
          pIVar20 = ValidationState_t::FindDef(_,uVar13);
          if ((pIVar20 == (Instruction *)0x0) || ((pIVar20->inst_).opcode == 0x13)) {
            ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218,"Source operand <id> ",0x14);
            ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar16);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218," cannot be a void pointer.",0x1a);
            sVar17 = local_48;
            goto LAB_002fd011;
          }
        }
        else {
          pIVar20 = (Instruction *)0x0;
        }
        if (((pIVar21 != (Instruction *)0x0) && (pIVar20 != (Instruction *)0x0)) &&
           ((pIVar21->inst_).result_id != (pIVar20->inst_).result_id)) {
          ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,"Target <id> ",0xc);
          ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar16);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,"s type does not match Source <id> ",0x22);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_280,_,(pIVar20->inst_).result_id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,(char *)local_280._0_8_,local_280._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"s type.",7);
          sVar17 = local_48;
          if ((ValidationState_t *)local_280._0_8_ != (ValidationState_t *)(local_280 + 0x10)) {
            operator_delete((void *)local_280._0_8_,(ulong)(local_280._16_8_ + 1));
          }
          goto LAB_002fd011;
        }
        if (pIVar21 == (Instruction *)0x0 && pIVar20 == (Instruction *)0x0) {
          ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,"One of Source or Target must be a typed pointer",0x2f);
          sVar17 = local_48;
          goto LAB_002fd02b;
        }
        sVar17 = anon_unknown_2::CheckMemoryAccess(_,inst,2);
        bVar10 = sVar17 == SPV_SUCCESS;
      }
      unaff_R15D = sVar17;
      if (!bVar10) break;
      goto LAB_002fd9a2;
    }
    uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar21 = ValidationState_t::FindDef(_,uVar13);
    if (pIVar21 == (Instruction *)0x0) {
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"Size operand <id> ",0x12);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
      pcVar32 = " is not defined.";
      lVar29 = 0x10;
LAB_002fd961:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar32,lVar29);
      sVar17 = local_48;
      if ((ValidationState_t *)local_2a8._M_unused._0_8_ != (ValidationState_t *)local_298) {
        operator_delete(local_2a8._M_unused._M_object,
                        (ulong)((long)(spv_target_env *)local_298._0_8_ + 1));
      }
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_218);
      goto LAB_002fd998;
    }
    pIVar24 = ValidationState_t::FindDef(_,(pIVar21->inst_).type_id);
    bVar10 = ValidationState_t::IsIntScalarType(_,(pIVar24->inst_).result_id);
    if (!bVar10) {
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"Size operand <id> ",0x12);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
      pcVar32 = " must be a scalar integer type.";
      lVar29 = 0x1f;
      goto LAB_002fd961;
    }
    uVar4 = (pIVar21->inst_).opcode;
    if (uVar4 == 0x2b) {
      if (((pIVar24->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start[3] != 1) ||
         (-1 < (int)(pIVar21->words_).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1])) {
        puVar6 = (pIVar21->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar27 = (long)(pIVar21->words_).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar6 >> 2;
        uVar30 = 3;
        if (3 < uVar27) {
          do {
            if (puVar6[uVar30] != 0) goto LAB_002fc626;
            uVar30 = uVar30 + 1;
          } while (uVar27 != uVar30);
        }
        goto LAB_002fd905;
      }
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"Size operand <id> ",0x12);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
      pcVar32 = " cannot have the sign bit set to 1.";
      lVar29 = 0x23;
      goto LAB_002fd961;
    }
    if (uVar4 == 0x2e) {
LAB_002fd905:
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"Size operand <id> ",0x12);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_2a8,_,uVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
      pcVar32 = " cannot be a constant zero.";
      lVar29 = 0x1b;
      goto LAB_002fd961;
    }
LAB_002fc626:
    pCVar1 = &_->module_capabilities_;
    bVar10 = EnumSet<spv::Capability>::contains(pCVar1,Shader);
    if (!bVar10) goto LAB_002fe28f;
    pIVar21 = (Instruction *)local_218;
    ValidationState_t::EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)pIVar21,_,uVar13);
    local_24c = local_218._0_4_;
    bVar10 = true;
    if (((local_218._0_4_ & 3) != 0 & local_218[4]) != 1) goto LAB_002fe287;
    local_40._0_4_ = Instruction::GetOperandAs<spv::StorageClass>(pIVar20,1);
    local_40._4_4_ = extraout_var_00;
    SVar14 = Instruction::GetOperandAs<spv::StorageClass>(local_258,1);
    local_38 = (_Base_ptr)CONCAT44(extraout_var_01,SVar14);
    bVar10 = EnumSet<spv::Capability>::contains(pCVar1,Int8);
    local_220 = (Function *)CONCAT71(local_220._1_7_,bVar10);
    bVar10 = EnumSet<spv::Capability>::contains(pCVar1,UniformAndStorageBuffer8BitAccess);
    bVar39 = EnumSet<spv::Capability>::contains(pCVar1,StorageBuffer8BitAccess);
    local_25a = EnumSet<spv::Capability>::contains(pCVar1,StoragePushConstant8);
    local_298[0x13] =
         EnumSet<spv::Capability>::contains(pCVar1,WorkgroupMemoryExplicitLayout8BitAccessKHR);
    local_259 = EnumSet<spv::Capability>::contains(pCVar1,Int16);
    bVar8 = EnumSet<spv::Capability>::contains(pCVar1,StorageUniform16);
    local_298[0x12] = bVar10 || bVar8;
    local_298[0x15] = bVar10;
    bVar9 = EnumSet<spv::Capability>::contains(pCVar1,StorageBuffer16BitAccess);
    uVar27 = CONCAT71(extraout_var,bVar9) & 0xffffffff;
    bVar38 = (byte)uVar27 | bVar8 | (bVar39 || bVar10);
    pIVar21 = (Instruction *)CONCAT71((int7)(uVar27 >> 8),bVar38);
    local_298[0x14] = bVar39 || bVar10;
    bVar10 = EnumSet<spv::Capability>::contains(pCVar1,StoragePushConstant16);
    bVar7 = local_25a;
    bVar37 = bVar10 | local_25a;
    local_298[0x16] = EnumSet<spv::Capability>::contains(pCVar1,StorageInputOutput16);
    bVar10 = EnumSet<spv::Capability>::contains(pCVar1,WorkgroupMemoryExplicitLayout16BitAccessKHR);
    pIVar20 = (Instruction *)(ulong)bVar10;
    bVar25 = 0;
    bVar28 = 0;
    switch((_Rb_tree_color)local_40) {
    case _S_black:
    case 3:
      bVar28 = 0;
      bVar25 = local_298[0x16];
      break;
    case 2:
      pIVar20 = (Instruction *)(ulong)local_298[0x12];
      bVar28 = local_298[0x15];
      goto LAB_002fe197;
    case 4:
      bVar28 = local_298[0x13];
      goto LAB_002fe197;
    case 5:
    case 6:
    case 7:
    case 8:
    case 10:
    case 0xb:
      break;
    case 9:
      bVar25 = bVar37;
      bVar28 = bVar7;
      break;
    case 0xc:
      pIVar20 = pIVar21;
      bVar28 = local_298[0x14];
LAB_002fe197:
      bVar25 = (byte)pIVar20;
      break;
    default:
      bVar28 = 0;
    }
    bVar35 = 0;
    bVar31 = 0;
    switch((int)local_38) {
    case 2:
      bVar35 = local_298[0x15];
      bVar31 = local_298[0x12];
      break;
    case 3:
      bVar35 = 0;
      bVar31 = local_298[0x16];
      break;
    case 4:
      bVar35 = local_298[0x13];
      bVar31 = bVar10;
      break;
    case 5:
    case 6:
    case 7:
    case 8:
    case 10:
    case 0xb:
      break;
    case 9:
      bVar35 = bVar7;
      bVar31 = bVar37;
      break;
    case 0xc:
      bVar35 = local_298[0x14];
      bVar31 = bVar38;
      break;
    default:
      bVar35 = 0;
      bVar31 = 0;
    }
    if ((local_259 == '\0' && (bVar25 & bVar31) == 0) && local_220._0_1_ == false) {
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      pcVar32 = "Size must be a multiple of 4";
LAB_002fe268:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar32,0x1c);
      pIVar21 = (Instruction *)(ulong)(uint)local_48;
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_218);
      bVar10 = false;
    }
    else {
      bVar10 = true;
      if ((local_220._0_1_ == false && (bVar28 & bVar35) == 0) && (local_24c & 1) != 0) {
        ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
        pcVar32 = "Size must be a multiple of 2";
        goto LAB_002fe268;
      }
    }
LAB_002fe287:
    sVar17 = (spv_result_t)pIVar21;
    if (bVar10) {
LAB_002fe28f:
      sVar18 = anon_unknown_2::CheckMemoryAccess(_,inst,3);
      bVar10 = sVar18 == SPV_SUCCESS;
      sVar17 = (spv_result_t)pIVar21;
      if (!bVar10) {
        sVar17 = sVar18;
      }
    }
    else {
LAB_002fd998:
      bVar10 = false;
    }
    unaff_R15D = sVar17;
    if (bVar10) {
LAB_002fd9a2:
      uVar3 = (inst->inst_).opcode;
      if (1 < uVar3 - 0x3f) {
        __assert_fail("inst->opcode() == spv::Op::OpCopyMemory || inst->opcode() == spv::Op::OpCopyMemorySized"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_memory.cpp"
                      ,0x494,
                      "spv_result_t spvtools::val::(anonymous namespace)::ValidateCopyMemoryMemoryAccess(ValidationState_t &, const Instruction *)"
                     );
      }
      uVar13 = uVar3 == 0x3f ^ 3;
      if ((ulong)uVar13 <
          (ulong)((long)(inst->operands_).
                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(inst->operands_).
                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4)) {
        unaff_R15D = anon_unknown_2::CheckMemoryAccess(_,inst,uVar13);
        if (unaff_R15D == SPV_SUCCESS) {
          uVar11 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)uVar13);
          uVar13 = (((uVar11 >> 3 & 1) + uVar13 + (uint)((uVar11 >> 4 & 1) != 0)) -
                   (uint)((uVar11 & 2) == 0)) + 2;
          bVar10 = true;
          if ((ulong)uVar13 <
              (ulong)((long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4)) {
            if ((_->features_).copy_memory_permits_two_memory_accesses == true) {
              sVar18 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar13);
              if (sVar18 == SPV_SUCCESS) {
                if ((uVar11 & 0x10) == 0) {
                  uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)uVar13);
                  bVar10 = (uVar13 & 8) == 0;
                  if (bVar10) goto LAB_002fe0b7;
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_DATA,inst);
                  pcVar32 = "Source memory access must not include MakePointerAvailableKHR";
                  lVar29 = 0x3d;
                }
                else {
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_DATA,inst);
                  pcVar32 = "Target memory access must not include MakePointerVisibleKHR";
                  lVar29 = 0x3b;
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218,pcVar32,lVar29);
                sVar18 = local_48;
                goto LAB_002fe0ad;
              }
            }
            else {
              ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_DATA,inst);
              local_2a8._M_unused._0_8_ = (undefined8)spvOpcodeString((uint)(inst->inst_).opcode);
              pDVar23 = DiagnosticStream::operator<<
                                  ((DiagnosticStream *)local_218,(char **)&local_2a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar23,
                         " with two memory access operands requires SPIR-V 1.4 or later",0x3d);
              sVar18 = pDVar23->error_;
LAB_002fe0ad:
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_218);
            }
            unaff_R15D = sVar18;
            bVar10 = false;
          }
LAB_002fe0b7:
          if (bVar10) goto LAB_002fe0bb;
        }
      }
      else {
LAB_002fe0bb:
        unaff_R15D = SPV_SUCCESS;
      }
      if (unaff_R15D == SPV_SUCCESS) {
        pIVar20 = local_258;
        if ((local_258->inst_).opcode == 0x20) {
          do {
            uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar20,2);
            pIVar20 = ValidationState_t::FindDef(_,uVar13);
          } while ((pIVar20->inst_).opcode == 0x20);
          bVar10 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,Shader);
          bVar39 = true;
          unaff_R15D = sVar17;
          if ((bVar10) &&
             (bVar10 = ValidationState_t::ContainsLimitedUseIntOrFloatType
                                 (_,(pIVar20->inst_).result_id), bVar10)) {
            ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218,
                       "Cannot copy memory of objects containing 8- or 16-bit types",0x3b);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_218);
            bVar39 = false;
            unaff_R15D = local_48;
          }
joined_r0x002fc34c:
          if (!bVar39) break;
        }
LAB_002fc352:
        unaff_R15D = SPV_SUCCESS;
      }
    }
    break;
  case 0x41:
  case 0x42:
  case 0x46:
switchD_002fa941_caseD_41:
    unaff_R15D = anon_unknown_2::ValidateAccessChain(_,inst);
    break;
  case 0x43:
switchD_002fa941_caseD_43:
    AVar12 = ValidationState_t::addressing_model(_);
    if (((AVar12 == Logical) && ((inst->inst_).opcode == 0x43)) &&
       ((_->features_).variable_pointers == false)) {
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"Generating variable pointers requires capability ",0x31);
      pcVar32 = "VariablePointers or VariablePointersStorageBuffer";
      lVar29 = 0x31;
LAB_002fbd60:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar32,lVar29);
      goto LAB_002fc071;
    }
    unaff_R15D = anon_unknown_2::ValidateAccessChain(_,inst);
    if (unaff_R15D != SPV_SUCCESS) break;
    bVar10 = spvOpcodeGeneratesUntypedPointer((uint)(inst->inst_).opcode);
    uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar20 = ValidationState_t::FindDef(_,uVar13);
    local_258 = (Instruction *)CONCAT71(local_258._1_7_,bVar10);
    if (bVar10) {
      uVar16 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    }
    else {
      uVar16 = (pIVar20->inst_).type_id;
    }
    pIVar20 = ValidationState_t::FindDef(_,uVar16);
    SVar14 = Instruction::GetOperandAs<spv::StorageClass>(pIVar20,1);
    pCVar1 = &_->module_capabilities_;
    bVar10 = EnumSet<spv::Capability>::contains(pCVar1,Shader);
    if ((bVar10) &&
       ((((SVar14 < (StorageBuffer|Input) && ((0x1204U >> (SVar14 & 0x1f) & 1) != 0)) ||
         ((SVar14 == PhysicalStorageBuffer ||
          ((bVar10 = EnumSet<spv::Capability>::contains(pCVar1,WorkgroupMemoryExplicitLayoutKHR),
           SVar14 == Workgroup && (bVar10)))))) &&
        (bVar10 = ValidationState_t::HasDecoration(_,(pIVar20->inst_).result_id,ArrayStride),
        !bVar10)))) {
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar32 = "OpPtrAccessChain must have a Base whose type is decorated with ArrayStride";
      lVar29 = 0x4a;
      goto LAB_002fbd60;
    }
    bVar10 = spvIsVulkanEnv(_->context_->target_env);
    if (!bVar10) goto LAB_002fc352;
    if ((char)local_258 == '\0') {
      bVar10 = false;
    }
    else {
      bVar10 = EnumSet<spv::Capability>::contains(pCVar1,UntypedPointersKHR);
    }
    bVar39 = true;
    if (SVar14 != PhysicalStorageBuffer) {
      if (SVar14 == StorageBuffer) {
        if (bVar10 == false && (_->features_).variable_pointers == false) {
          ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_DATA,inst);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2a8,_,0x1de4,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
          pcVar32 = 
          "OpPtrAccessChain Base operand pointing to StorageBuffer storage class must use VariablePointers or VariablePointersStorageBuffer capability"
          ;
          lVar29 = 0x8b;
          goto LAB_002fc312;
        }
      }
      else if (SVar14 == Workgroup) {
        bVar8 = EnumSet<spv::Capability>::contains(pCVar1,VariablePointers);
        bVar39 = true;
        if (bVar10 == false && !bVar8) {
          ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_DATA,inst);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2a8,_,0x1de3,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
          pcVar32 = 
          "OpPtrAccessChain Base operand pointing to Workgroup storage class must use VariablePointers capability"
          ;
          lVar29 = 0x66;
LAB_002fc312:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar32,lVar29);
          if ((ValidationState_t *)local_2a8._M_unused._0_8_ != (ValidationState_t *)local_298) {
            operator_delete(local_2a8._M_unused._M_object,
                            (ulong)((long)(spv_target_env *)local_298._0_8_ + 1));
          }
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_218);
          bVar39 = false;
          unaff_R15D = local_48;
        }
      }
      else if (bVar10 == false) {
        ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_DATA,inst);
        ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2a8,_,0x1de2,(char *)0x0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
        pcVar32 = 
        "OpPtrAccessChain Base operand must point to Workgroup, StorageBuffer, or PhysicalStorageBuffer storage class"
        ;
        lVar29 = 0x6c;
        goto LAB_002fc312;
      }
    }
    goto joined_r0x002fc34c;
  case 0x44:
switchD_002fa941_caseD_44:
    pcVar32 = spvOpcodeString((uint)uVar3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_218,pcVar32,(allocator<char> *)local_280);
    puVar22 = (undefined8 *)std::__cxx11::string::replace((ulong)local_218,0,(char *)0x0,0x371e9f);
    local_2a8._M_unused._M_object = local_298;
    plVar19 = puVar22 + 2;
    if ((long *)*puVar22 == plVar19) {
      local_298._0_8_ = *plVar19;
      local_298._8_8_ = puVar22[3];
    }
    else {
      local_298._0_8_ = *plVar19;
      local_2a8._M_unused._M_object = (long *)*puVar22;
    }
    local_2a8._8_8_ = puVar22[1];
    *puVar22 = plVar19;
    puVar22[1] = 0;
    *(undefined1 *)(puVar22 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_218._4_4_,local_218._0_4_) != local_208) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_218._4_4_,local_218._0_4_),
                      local_208[0]._M_allocated_capacity + 1);
    }
    pIVar20 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if ((((pIVar20->inst_).opcode != 0x15) ||
        (uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar20,1), uVar13 != 0x20)) ||
       (uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar20,2), uVar13 != 0)) {
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"The Result Type of ",0x13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218," <id> ",6);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_280,_,(inst->inst_).result_id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,(char *)local_280._0_8_,local_280._8_8_);
      pcVar32 = " must be OpTypeInt with width 32 and signedness 0.";
      lVar29 = 0x32;
      goto LAB_002fb443;
    }
    uVar4 = (inst->inst_).opcode;
    uVar16 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)(uVar4 == 0x1149) | 2);
    pIVar20 = ValidationState_t::FindDef(_,uVar16);
    uVar5 = (pIVar20->inst_).opcode;
    if (uVar4 != 0x1149) {
      if (uVar5 == 0x20) goto LAB_002fc364;
LAB_002fc468:
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"The Structure\'s type in ",0x18);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218," <id> ",6);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_280,_,(inst->inst_).result_id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,(char *)local_280._0_8_,local_280._8_8_);
      pcVar32 = " must be a pointer to an OpTypeStruct.";
      lVar29 = 0x26;
      goto LAB_002fb443;
    }
    pIVar20 = inst;
    if (uVar5 != 0x1141) {
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"Pointer must be an untyped pointer",0x22);
      unaff_R15D = local_48;
      goto LAB_002fc138;
    }
LAB_002fc364:
    uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar20,2);
    pIVar20 = ValidationState_t::FindDef(_,uVar13);
    if ((pIVar20->inst_).opcode != 0x1e) goto LAB_002fc468;
    lVar29 = (long)(pIVar20->operands_).
                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pIVar20->operands_).
                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4;
    uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar20,lVar29 - 1);
    pIVar20 = ValidationState_t::FindDef(_,uVar13);
    if ((pIVar20->inst_).opcode != 0x1d) {
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"The Structure\'s last member in ",0x1f);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218," <id> ",6);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_280,_,(inst->inst_).result_id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,(char *)local_280._0_8_,local_280._8_8_);
      pcVar32 = " must be an OpTypeRuntimeArray.";
      lVar29 = 0x1f;
LAB_002fb443:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar32,lVar29);
      unaff_R15D = local_48;
      goto LAB_002fc119;
    }
    uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)(uVar4 == 0x1149) + 3);
    unaff_R15D = SPV_SUCCESS;
    if (lVar29 - 2U != (ulong)uVar13) {
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"The array member in ",0x14);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,(char *)local_2a8._M_unused._0_8_,local_2a8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218," <id> ",6);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_280,_,(inst->inst_).result_id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,(char *)local_280._0_8_,local_280._8_8_);
      pcVar32 = " must be the last member of the struct.";
      lVar29 = 0x27;
      goto LAB_002fb443;
    }
LAB_002fc13d:
    if ((undefined1 *)local_2a8._M_unused._0_8_ != local_298) {
LAB_002fc146:
      operator_delete(local_2a8._M_unused._M_object,
                      (ulong)((long)(spv_target_env *)local_298._0_8_ + 1));
    }
    break;
  default:
    if (uVar3 - OpPtrEqual < 3) {
      AVar12 = ValidationState_t::addressing_model(_);
      if ((AVar12 == Logical) && ((_->features_).variable_pointers == false)) {
        ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
        pcVar32 = 
        "Instruction cannot for logical addressing model be used without a variable pointers capability"
        ;
        lVar29 = 0x5e;
      }
      else {
        pIVar20 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
        if ((inst->inst_).opcode == 0x193) {
          if ((pIVar20 == (Instruction *)0x0) || ((pIVar20->inst_).opcode != 0x15)) {
            ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
            pcVar32 = "Result Type must be an integer scalar";
            lVar29 = 0x25;
          }
          else {
LAB_002fad49:
            uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,2);
            pIVar20 = ValidationState_t::FindDef(_,uVar13);
            uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,3);
            pIVar21 = ValidationState_t::FindDef(_,uVar13);
            if ((pIVar21 == (Instruction *)0x0 || pIVar20 == (Instruction *)0x0) ||
               (uVar16 = (pIVar20->inst_).type_id, uVar16 != (pIVar21->inst_).type_id)) {
              ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
              pcVar32 = "The types of Operand 1 and Operand 2 must match";
              lVar29 = 0x2f;
            }
            else {
              pIVar20 = ValidationState_t::FindDef(_,uVar16);
              if ((pIVar20 == (Instruction *)0x0) ||
                 ((uVar4 = (pIVar20->inst_).opcode, uVar4 != 0x20 && (uVar4 != 0x1141)))) {
                ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
                pcVar32 = "Operand type must be a pointer";
                goto LAB_002fb338;
              }
              SVar14 = Instruction::GetOperandAs<spv::StorageClass>(pIVar20,1);
              AVar12 = ValidationState_t::addressing_model(_);
              if (AVar12 == Logical) {
                if ((SVar14 & ~Generic) == Workgroup) {
                  unaff_R15D = SPV_SUCCESS;
                  if ((SVar14 != Workgroup) ||
                     (bVar10 = EnumSet<spv::Capability>::contains
                                         (&_->module_capabilities_,VariablePointers), bVar10))
                  break;
                  ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst)
                  ;
                  pcVar32 = 
                  "Workgroup storage class pointer requires VariablePointers capability to be specified"
                  ;
                  lVar29 = 0x54;
                }
                else {
                  ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst)
                  ;
                  pcVar32 = "Invalid pointer storage class";
                  lVar29 = 0x1d;
                }
              }
              else {
                unaff_R15D = SPV_SUCCESS;
                if (SVar14 != PhysicalStorageBuffer) break;
                ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
                pcVar32 = "Cannot use a pointer in the PhysicalStorageBuffer storage class";
                lVar29 = 0x3f;
              }
            }
          }
        }
        else {
          if ((pIVar20 != (Instruction *)0x0) && ((pIVar20->inst_).opcode == 0x14))
          goto LAB_002fad49;
          ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
          pcVar32 = "Result Type must be OpTypeBool";
LAB_002fb338:
          lVar29 = 0x1e;
        }
      }
      goto LAB_002fbd60;
    }
    goto switchD_002fa941_caseD_3c;
  }
joined_r0x002fc156:
  if (unaff_R15D == SPV_SUCCESS) {
switchD_002fa941_caseD_3c:
    unaff_R15D = SPV_SUCCESS;
  }
  return unaff_R15D;
}

Assistant:

spv_result_t MemoryPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpVariable:
    case spv::Op::OpUntypedVariableKHR:
      if (auto error = ValidateVariable(_, inst)) return error;
      break;
    case spv::Op::OpLoad:
      if (auto error = ValidateLoad(_, inst)) return error;
      break;
    case spv::Op::OpStore:
      if (auto error = ValidateStore(_, inst)) return error;
      break;
    case spv::Op::OpCopyMemory:
    case spv::Op::OpCopyMemorySized:
      if (auto error = ValidateCopyMemory(_, inst)) return error;
      break;
    case spv::Op::OpPtrAccessChain:
    case spv::Op::OpUntypedPtrAccessChainKHR:
    case spv::Op::OpUntypedInBoundsPtrAccessChainKHR:
      if (auto error = ValidatePtrAccessChain(_, inst)) return error;
      break;
    case spv::Op::OpAccessChain:
    case spv::Op::OpInBoundsAccessChain:
    case spv::Op::OpInBoundsPtrAccessChain:
    case spv::Op::OpUntypedAccessChainKHR:
    case spv::Op::OpUntypedInBoundsAccessChainKHR:
      if (auto error = ValidateAccessChain(_, inst)) return error;
      break;
    case spv::Op::OpRawAccessChainNV:
      if (auto error = ValidateRawAccessChain(_, inst)) return error;
      break;
    case spv::Op::OpArrayLength:
    case spv::Op::OpUntypedArrayLengthKHR:
      if (auto error = ValidateArrayLength(_, inst)) return error;
      break;
    case spv::Op::OpCooperativeMatrixLoadNV:
    case spv::Op::OpCooperativeMatrixStoreNV:
      if (auto error = ValidateCooperativeMatrixLoadStoreNV(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeMatrixLengthKHR:
    case spv::Op::OpCooperativeMatrixLengthNV:
      if (auto error = ValidateCooperativeMatrixLengthNV(_, inst)) return error;
      break;
    case spv::Op::OpCooperativeMatrixLoadKHR:
    case spv::Op::OpCooperativeMatrixStoreKHR:
      if (auto error = ValidateCooperativeMatrixLoadStoreKHR(_, inst))
        return error;
      break;
    case spv::Op::OpPtrEqual:
    case spv::Op::OpPtrNotEqual:
    case spv::Op::OpPtrDiff:
      if (auto error = ValidatePtrComparison(_, inst)) return error;
      break;
    case spv::Op::OpImageTexelPointer:
    case spv::Op::OpGenericPtrMemSemantics:
    default:
      break;
  }

  return SPV_SUCCESS;
}